

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O0

mkv_timestamp_t MATROSKA_ClusterTimestamp(matroska_cluster *Cluster)

{
  ebml_context *peVar1;
  bool_t bVar2;
  ebml_integer *Element;
  int64_t iVar3;
  mkv_timestamp_t mVar4;
  ebml_integer *Timestamp;
  matroska_cluster *Cluster_local;
  
  peVar1 = MATROSKA_getContextCluster();
  bVar2 = EBML_ElementIsType((ebml_element *)Cluster,peVar1);
  if (bVar2 == 0) {
    __assert_fail("EBML_ElementIsType((ebml_element*)Cluster, MATROSKA_getContextCluster())",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                  ,0x27e,"mkv_timestamp_t MATROSKA_ClusterTimestamp(matroska_cluster *)");
  }
  if (Cluster->GlobalTimestamp == 0x7fffffffffffffff) {
    peVar1 = MATROSKA_getContextTimestamp();
    Element = (ebml_integer *)EBML_MasterFindFirstElt(&Cluster->Base,peVar1,0,0,0);
    if (Element != (ebml_integer *)0x0) {
      iVar3 = EBML_IntegerValue(Element);
      mVar4 = MATROSKA_SegmentInfoTimestampScale(Cluster->ReadSegInfo);
      Cluster->GlobalTimestamp = iVar3 * mVar4;
    }
  }
  return Cluster->GlobalTimestamp;
}

Assistant:

mkv_timestamp_t MATROSKA_ClusterTimestamp(matroska_cluster *Cluster)
{
    assert(EBML_ElementIsType((ebml_element*)Cluster, MATROSKA_getContextCluster()));
    if (Cluster->GlobalTimestamp == INVALID_TIMESTAMP_T)
    {
        ebml_integer *Timestamp = (ebml_integer*)EBML_MasterFindChild((ebml_master*)Cluster,MATROSKA_getContextTimestamp());
        if (Timestamp)
            Cluster->GlobalTimestamp = EBML_IntegerValue(Timestamp) * MATROSKA_SegmentInfoTimestampScale(Cluster->ReadSegInfo);
    }
    return Cluster->GlobalTimestamp;
}